

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputAESEncodeStream.cpp
# Opt level: O3

void __thiscall
OutputAESEncodeStream::OutputAESEncodeStream
          (OutputAESEncodeStream *this,IByteWriterWithPosition *inTargetStream,
          ByteList *inEncryptionKey,bool inOwnsStream)

{
  uchar *key;
  long lVar1;
  _List_node_base *p_Var2;
  ulong uVar3;
  
  (this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter =
       (_func_int **)&PTR__OutputAESEncodeStream_003a7c00;
  aes_init();
  this->mTargetStream = inTargetStream;
  this->mOwnsStream = inOwnsStream;
  if (inTargetStream != (IByteWriterWithPosition *)0x0) {
    this->mInIndex = this->mIn;
    uVar3 = (inEncryptionKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>).
            _M_impl._M_node._M_size;
    key = (uchar *)operator_new__(uVar3);
    this->mEncryptionKey = key;
    this->mEncryptionKeyLength = uVar3;
    p_Var2 = (inEncryptionKey->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 != (_List_node_base *)inEncryptionKey) {
      lVar1 = 0;
      do {
        this->mEncryptionKey[lVar1] = *(uchar *)&p_Var2[1]._M_next;
        lVar1 = lVar1 + 1;
        p_Var2 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var2->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var2 != (_List_node_base *)inEncryptionKey);
      key = this->mEncryptionKey;
      uVar3 = this->mEncryptionKeyLength;
    }
    aes_encrypt_key(key,(int)uVar3,(this->mEncrypt).cx);
    this->mWroteIV = false;
  }
  return;
}

Assistant:

OutputAESEncodeStream::OutputAESEncodeStream(IByteWriterWithPosition* inTargetStream, const ByteList& inEncryptionKey, bool inOwnsStream) 
{
	mTargetStream = inTargetStream;
	mOwnsStream = inOwnsStream;

	if (!mTargetStream)
		return;

	mInIndex = mIn;

	// convert inEncryptionKey to internal rep and init encrypt [let's hope its 16...]
	mEncryptionKey = new unsigned char[inEncryptionKey.size()];
	mEncryptionKeyLength = inEncryptionKey.size();
	ByteList::const_iterator it = inEncryptionKey.begin();
	size_t i = 0;
	for (; it != inEncryptionKey.end(); ++i, ++it)
		mEncryptionKey[i] = *it;
	mEncrypt.key(mEncryptionKey, mEncryptionKeyLength);
	
	mWroteIV = false;

}